

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_type(lua_State *L,int idx)

{
  TValue *pTVar1;
  int in_ESI;
  lua_State *in_RDI;
  int tt;
  uint32_t t;
  cTValue *o;
  uint local_4;
  
  pTVar1 = index2adr(in_RDI,in_ESI);
  if ((pTVar1->field_2).it < 0xffff0000) {
    local_4 = 3;
  }
  else if ((int)(pTVar1->field_2).it >> 0xf == -2) {
    local_4 = 2;
  }
  else if (pTVar1 == (TValue *)((ulong)(in_RDI->glref).ptr32 + 0x68)) {
    local_4 = 0xffffffff;
  }
  else {
    local_4 = (uint)(0x75a0698042110 >> ((byte)(((pTVar1->field_2).it ^ 0xffffffff) << 2) & 0x3f)) &
              0xf;
  }
  return local_4;
}

Assistant:

LUA_API int lua_type(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  if (tvisnumber(o)) {
    return LUA_TNUMBER;
#if LJ_64
  } else if (tvislightud(o)) {
    return LUA_TLIGHTUSERDATA;
#endif
  } else if (o == niltv(L)) {
    return LUA_TNONE;
  } else {  /* Magic internal/external tag conversion. ORDER LJ_T */
    uint32_t t = ~itype(o);
#if LJ_64
    int tt = (int)((U64x(75a06,98042110) >> 4*t) & 15u);
#else
    int tt = (int)(((t < 8 ? 0x98042110u : 0x75a06u) >> 4*(t&7)) & 15u);
#endif
    lua_assert(tt != LUA_TNIL || tvisnil(o));
    return tt;
  }
}